

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::Cardinality::DescribeActualCallCountTo(int actual_call_count,ostream *os)

{
  ostream *poVar1;
  int n;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  int actual_call_count_local;
  
  local_18 = os;
  os_local._4_4_ = actual_call_count;
  if (actual_call_count < 1) {
    std::operator<<(os,"never called");
  }
  else {
    poVar1 = std::operator<<(os,"called ");
    (anonymous_namespace)::FormatTimes_abi_cxx11_
              (&local_38,(_anonymous_namespace_ *)(ulong)os_local._4_4_,n);
    std::operator<<(poVar1,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void Cardinality::DescribeActualCallCountTo(int actual_call_count,
                                            ::std::ostream* os) {
  if (actual_call_count > 0) {
    *os << "called " << FormatTimes(actual_call_count);
  } else {
    *os << "never called";
  }
}